

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

uint __thiscall crnlib::symbol_codec::get_bits(symbol_codec *this,uint num_bits)

{
  byte *pbVar1;
  uint local_20;
  uint result;
  uint c;
  uint num_bits_local;
  symbol_codec *this_local;
  
  if (num_bits == 0) {
    this_local._4_4_ = 0;
  }
  else {
    while (this->m_bit_count < (int)num_bits) {
      local_20 = 0;
      if (this->m_pDecode_buf_next == this->m_pDecode_buf_end) {
        if ((this->m_decode_buf_eof & 1U) == 0) {
          (*this->m_pDecode_need_bytes_func)
                    ((long)this->m_pDecode_buf_next - (long)this->m_pDecode_buf,
                     this->m_pDecode_private_data,&this->m_pDecode_buf,&this->m_decode_buf_size,
                     &this->m_decode_buf_eof);
          this->m_pDecode_buf_end = this->m_pDecode_buf + this->m_decode_buf_size;
          this->m_pDecode_buf_next = this->m_pDecode_buf;
          if (this->m_pDecode_buf_next < this->m_pDecode_buf_end) {
            pbVar1 = this->m_pDecode_buf_next;
            this->m_pDecode_buf_next = pbVar1 + 1;
            local_20 = (uint)*pbVar1;
          }
        }
      }
      else {
        pbVar1 = this->m_pDecode_buf_next;
        this->m_pDecode_buf_next = pbVar1 + 1;
        local_20 = (uint)*pbVar1;
      }
      this->m_bit_count = this->m_bit_count + 8;
      this->m_bit_buf = local_20 << (0x20U - (char)this->m_bit_count & 0x1f) | this->m_bit_buf;
    }
    this_local._4_4_ = this->m_bit_buf >> (0x20 - (byte)num_bits & 0x1f);
    this->m_bit_buf = this->m_bit_buf << ((byte)num_bits & 0x1f);
    this->m_bit_count = this->m_bit_count - num_bits;
  }
  return this_local._4_4_;
}

Assistant:

uint symbol_codec::get_bits(uint num_bits) {
  CRNLIB_ASSERT(num_bits <= 25);

  if (!num_bits)
    return 0;

  while (m_bit_count < (int)num_bits) {
    uint c = 0;
    if (m_pDecode_buf_next == m_pDecode_buf_end) {
      if (!m_decode_buf_eof) {
        m_pDecode_need_bytes_func(m_pDecode_buf_next - m_pDecode_buf, m_pDecode_private_data, m_pDecode_buf, m_decode_buf_size, m_decode_buf_eof);
        m_pDecode_buf_end = m_pDecode_buf + m_decode_buf_size;
        m_pDecode_buf_next = m_pDecode_buf;
        if (m_pDecode_buf_next < m_pDecode_buf_end)
          c = *m_pDecode_buf_next++;
      }
    } else
      c = *m_pDecode_buf_next++;

    m_bit_count += 8;
    CRNLIB_ASSERT(m_bit_count <= cBitBufSize);

    m_bit_buf |= (static_cast<bit_buf_t>(c) << (cBitBufSize - m_bit_count));
  }

  uint result = static_cast<uint>(m_bit_buf >> (cBitBufSize - num_bits));

  m_bit_buf <<= num_bits;
  m_bit_count -= num_bits;

  return result;
}